

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O0

void __thiscall
icu_63::numparse::impl::NumberParserImpl::parseLongestRecursive
          (NumberParserImpl *this,StringSegment *segment,ParsedNumber *result,UErrorCode *status)

{
  NumberParseMatcher *pNVar1;
  UBool UVar2;
  bool bVar3;
  int32_t iVar4;
  uint uVar5;
  int32_t iVar6;
  NumberParseMatcher **ppNVar7;
  int local_20c;
  bool maybeMore;
  int32_t charsToConsume;
  NumberParseMatcher *matcher;
  int32_t i;
  int initialOffset;
  undefined1 local_1e8 [8];
  ParsedNumber candidate;
  ParsedNumber initial;
  UErrorCode *status_local;
  ParsedNumber *result_local;
  StringSegment *segment_local;
  NumberParserImpl *this_local;
  
  iVar4 = StringSegment::length(segment);
  if (iVar4 != 0) {
    ParsedNumber::ParsedNumber((ParsedNumber *)candidate.currencyCode,result);
    ParsedNumber::ParsedNumber((ParsedNumber *)local_1e8);
    iVar4 = StringSegment::getOffset(segment);
    for (matcher._4_4_ = 0; matcher._4_4_ < this->fNumMatchers; matcher._4_4_ = matcher._4_4_ + 1) {
      ppNVar7 = MaybeStackArray<const_icu_63::numparse::impl::NumberParseMatcher_*,_10>::operator[]
                          (&this->fMatchers,(long)matcher._4_4_);
      pNVar1 = *ppNVar7;
      uVar5 = (*pNVar1->_vptr_NumberParseMatcher[4])(pNVar1,segment);
      if ((uVar5 & 1) != 0) {
        local_20c = 0;
        do {
          iVar6 = StringSegment::length(segment);
          if (iVar6 <= local_20c) break;
          uVar5 = StringSegment::codePointAt(segment,local_20c);
          local_20c = (local_20c - (uint)(uVar5 < 0x10000)) + 2;
          ParsedNumber::operator=((ParsedNumber *)local_1e8,(ParsedNumber *)candidate.currencyCode);
          StringSegment::setLength(segment,local_20c);
          uVar5 = (*pNVar1->_vptr_NumberParseMatcher[3])(pNVar1,segment,local_1e8,status);
          StringSegment::resetLength(segment);
          UVar2 = ::U_FAILURE(*status);
          if (UVar2 != '\0') goto LAB_002fd7f7;
          iVar6 = StringSegment::getOffset(segment);
          if (iVar6 - iVar4 == local_20c) {
            parseLongestRecursive(this,segment,(ParsedNumber *)local_1e8,status);
            UVar2 = ::U_FAILURE(*status);
            if (UVar2 != '\0') goto LAB_002fd7f7;
            bVar3 = ParsedNumber::isBetterThan((ParsedNumber *)local_1e8,result);
            if (bVar3) {
              ParsedNumber::operator=(result,(ParsedNumber *)local_1e8);
            }
          }
          StringSegment::setOffset(segment,iVar4);
        } while ((uVar5 & 1) != 0);
      }
    }
LAB_002fd7f7:
    ParsedNumber::~ParsedNumber((ParsedNumber *)local_1e8);
    ParsedNumber::~ParsedNumber((ParsedNumber *)candidate.currencyCode);
  }
  return;
}

Assistant:

void NumberParserImpl::parseLongestRecursive(StringSegment& segment, ParsedNumber& result,
                                             UErrorCode& status) const {
    // Base Case
    if (segment.length() == 0) {
        return;
    }

    // TODO: Give a nice way for the matcher to reset the ParsedNumber?
    ParsedNumber initial(result);
    ParsedNumber candidate;

    int initialOffset = segment.getOffset();
    for (int32_t i = 0; i < fNumMatchers; i++) {
        const NumberParseMatcher* matcher = fMatchers[i];
        if (!matcher->smokeTest(segment)) {
            continue;
        }

        // In a non-greedy parse, we attempt all possible matches and pick the best.
        for (int32_t charsToConsume = 0; charsToConsume < segment.length();) {
            charsToConsume += U16_LENGTH(segment.codePointAt(charsToConsume));

            // Run the matcher on a segment of the current length.
            candidate = initial;
            segment.setLength(charsToConsume);
            bool maybeMore = matcher->match(segment, candidate, status);
            segment.resetLength();
            if (U_FAILURE(status)) {
                return;
            }

            // If the entire segment was consumed, recurse.
            if (segment.getOffset() - initialOffset == charsToConsume) {
                parseLongestRecursive(segment, candidate, status);
                if (U_FAILURE(status)) {
                    return;
                }
                if (candidate.isBetterThan(result)) {
                    result = candidate;
                }
            }

            // Since the segment can be re-used, reset the offset.
            // This does not have an effect if the matcher did not consume any chars.
            segment.setOffset(initialOffset);

            // Unless the matcher wants to see the next char, continue to the next matcher.
            if (!maybeMore) {
                break;
            }
        }
    }
}